

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void blend_a64_mask_w16n_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  uint in_ECX;
  uint8_t *in_RDX;
  uint in_ESI;
  long lVar1;
  long in_RDI;
  __m128i *in_R8;
  uint in_R9D;
  __m128i alVar2;
  long in_stack_00000008;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  int c;
  __m128i _r;
  __m128i v_maxval_b;
  int local_cc;
  __m128i *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  long local_78;
  
  local_78 = in_RDI;
  do {
    for (local_cc = 0; local_cc < (int)v_res_b[1]; local_cc = local_cc + 0x10) {
      xx_loadu_128((void *)(in_stack_00000008 + local_cc));
      lVar1 = (long)*in_R8 + (long)local_cc;
      alVar2 = blend_16_u8(in_RDX,(uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff70),in_R8,
                           (__m128i *)CONCAT44(in_R9D,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff58);
      alVar2[0] = lVar1;
      xx_storeu_128((void *)(local_78 + local_cc),alVar2);
    }
    local_78 = local_78 + (ulong)in_ESI;
    in_RDX = in_RDX + in_ECX;
    in_R8 = (__m128i *)((long)*in_R8 + (ulong)in_R9D);
    in_stack_00000008 = in_stack_00000008 + (ulong)(uint)v_res_b[0];
    v_m1_b[0]._0_4_ = (int)v_m1_b[0] + -1;
  } while ((int)v_m1_b[0] != 0);
  return;
}

Assistant:

static void blend_a64_mask_w16n_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));

  do {
    int c;
    for (c = 0; c < w; c += 16) {
      const __m128i v_m0_b = xx_loadu_128(mask + c);
      const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);

      const __m128i v_res_b =
          blend_16_u8(src0 + c, src1 + c, &v_m0_b, &v_m1_b, &_r);

      xx_storeu_128(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}